

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

ssize_t strhex_from_bin(char *buffer,size_t buffer_len,uint8_t *src,size_t src_len)

{
  ssize_t sVar1;
  size_t sVar2;
  
  sVar1 = -1;
  if (src_len * 2 < buffer_len) {
    sVar1 = 0;
    if (src_len != 0) {
      sVar2 = 0;
      do {
        buffer[sVar1] = "0123456789abcdef"[src[sVar2] >> 4];
        buffer[sVar1 + 1] = "0123456789abcdef"[src[sVar2] & 0xf];
        sVar1 = sVar1 + 2;
        sVar2 = sVar2 + 1;
      } while (src_len != sVar2);
    }
    buffer[sVar1] = '\0';
  }
  return sVar1;
}

Assistant:

ssize_t
strhex_from_bin(char *buffer, size_t buffer_len, const uint8_t *src, size_t src_len) {
  static char HEX[] = "0123456789abcdef";
  size_t i, j;
  if (buffer_len < src_len*2+1) {
    return -1;
  }

  for (i=0, j=0; i<src_len; i++) {
    buffer[j++] = HEX[src[i] >> 4];
    buffer[j++] = HEX[src[i] & 0x0f];
  }
  buffer[j] = 0;
  return j;
}